

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void variance_double_1_suite::test_many(void)

{
  undefined8 local_158;
  value_type local_150 [2];
  undefined8 local_140;
  value_type local_138 [2];
  undefined8 local_128;
  value_type local_120;
  undefined4 local_114;
  size_type local_110;
  undefined1 local_106;
  undefined1 local_105 [2];
  undefined1 local_103;
  undefined1 local_102 [2];
  undefined8 local_100;
  value_type local_f8 [2];
  undefined8 local_e8;
  value_type local_e0 [2];
  undefined8 local_d0;
  value_type local_c8;
  undefined4 local_bc;
  size_type local_b8;
  undefined1 local_ae;
  undefined1 local_ad [2];
  undefined1 local_ab;
  undefined1 local_aa [2];
  undefined8 local_a8;
  value_type local_a0 [2];
  undefined8 local_90;
  value_type local_88 [2];
  undefined8 local_78;
  value_type local_70;
  undefined4 local_64;
  size_type local_60;
  undefined1 local_52;
  undefined1 local_51 [2];
  undefined1 local_4f;
  undefined1 local_4e [2];
  undefined4 local_4c;
  size_type local_48 [2];
  undefined1 local_38 [8];
  moment_variance<double,_1> filter;
  
  trial::online::window::basic_moment<double,_1UL,_(trial::online::with)2>::basic_moment
            ((basic_moment<double,_1UL,_(trial::online::with)2> *)local_38);
  local_48[0] = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)1>::capacity
                          ((basic_moment<double,_1UL,_(trial::online::with)1> *)local_38);
  local_4c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.capacity()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1ee,"void variance_double_1_suite::test_many()",local_48,&local_4c);
  trial::online::window::basic_moment<double,_1UL,_(trial::online::with)2>::push
            ((basic_moment<double,_1UL,_(trial::online::with)2> *)local_38,1.0);
  local_4e[0] = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)1>::empty
                          ((basic_moment<double,_1UL,_(trial::online::with)1> *)local_38);
  local_4f = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1f0,"void variance_double_1_suite::test_many()",local_4e,&local_4f);
  local_51[0] = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)1>::full
                          ((basic_moment<double,_1UL,_(trial::online::with)1> *)local_38);
  local_52 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","true",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1f1,"void variance_double_1_suite::test_many()",local_51,&local_52);
  local_60 = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)1>::size
                       ((basic_moment<double,_1UL,_(trial::online::with)1> *)local_38);
  local_64 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1f2,"void variance_double_1_suite::test_many()",&local_60,&local_64);
  local_70 = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)1>::mean
                       ((basic_moment<double,_1UL,_(trial::online::with)1> *)local_38);
  local_78 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,499,"void variance_double_1_suite::test_many()",&local_70,&local_78);
  local_88[0] = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)2>::variance
                          ((basic_moment<double,_1UL,_(trial::online::with)2> *)local_38);
  local_90 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,500,"void variance_double_1_suite::test_many()",local_88,&local_90);
  local_a0[0] = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)2>::
                unbiased_variance((basic_moment<double,_1UL,_(trial::online::with)2> *)local_38);
  local_a8 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.unbiased_variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1f5,"void variance_double_1_suite::test_many()",local_a0,&local_a8);
  trial::online::window::basic_moment<double,_1UL,_(trial::online::with)2>::push
            ((basic_moment<double,_1UL,_(trial::online::with)2> *)local_38,2.0);
  local_aa[0] = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)1>::empty
                          ((basic_moment<double,_1UL,_(trial::online::with)1> *)local_38);
  local_ab = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1f7,"void variance_double_1_suite::test_many()",local_aa,&local_ab);
  local_ad[0] = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)1>::full
                          ((basic_moment<double,_1UL,_(trial::online::with)1> *)local_38);
  local_ae = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","true",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1f8,"void variance_double_1_suite::test_many()",local_ad,&local_ae);
  local_b8 = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)1>::size
                       ((basic_moment<double,_1UL,_(trial::online::with)1> *)local_38);
  local_bc = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1f9,"void variance_double_1_suite::test_many()",&local_b8,&local_bc);
  local_c8 = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)1>::mean
                       ((basic_moment<double,_1UL,_(trial::online::with)1> *)local_38);
  local_d0 = 0x4000000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","2.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1fa,"void variance_double_1_suite::test_many()",&local_c8,&local_d0);
  local_e0[0] = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)2>::variance
                          ((basic_moment<double,_1UL,_(trial::online::with)2> *)local_38);
  local_e8 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1fb,"void variance_double_1_suite::test_many()",local_e0,&local_e8);
  local_f8[0] = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)2>::
                unbiased_variance((basic_moment<double,_1UL,_(trial::online::with)2> *)local_38);
  local_100 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.unbiased_variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1fc,"void variance_double_1_suite::test_many()",local_f8,&local_100);
  trial::online::window::basic_moment<double,_1UL,_(trial::online::with)2>::push
            ((basic_moment<double,_1UL,_(trial::online::with)2> *)local_38,3.0);
  local_102[0] = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)1>::empty
                           ((basic_moment<double,_1UL,_(trial::online::with)1> *)local_38);
  local_103 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1fe,"void variance_double_1_suite::test_many()",local_102,&local_103);
  local_105[0] = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)1>::full
                           ((basic_moment<double,_1UL,_(trial::online::with)1> *)local_38);
  local_106 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","true",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1ff,"void variance_double_1_suite::test_many()",local_105,&local_106);
  local_110 = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)1>::size
                        ((basic_moment<double,_1UL,_(trial::online::with)1> *)local_38);
  local_114 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x200,"void variance_double_1_suite::test_many()",&local_110,&local_114);
  local_120 = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)1>::mean
                        ((basic_moment<double,_1UL,_(trial::online::with)1> *)local_38);
  local_128 = 0x4008000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","3.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x201,"void variance_double_1_suite::test_many()",&local_120,&local_128);
  local_138[0] = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)2>::variance
                           ((basic_moment<double,_1UL,_(trial::online::with)2> *)local_38);
  local_140 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x202,"void variance_double_1_suite::test_many()",local_138,&local_140);
  local_150[0] = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)2>::
                 unbiased_variance((basic_moment<double,_1UL,_(trial::online::with)2> *)local_38);
  local_158 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.unbiased_variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x203,"void variance_double_1_suite::test_many()",local_150,&local_158);
  return;
}

Assistant:

void test_many()
{
    window::moment_variance<double, 1> filter;
    TRIAL_TEST_EQ(filter.capacity(), 1);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.empty(), false);
    TRIAL_TEST_EQ(filter.full(), true);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.unbiased_variance(), 0.0);
    filter.push(2.0);
    TRIAL_TEST_EQ(filter.empty(), false);
    TRIAL_TEST_EQ(filter.full(), true);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 2.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.unbiased_variance(), 0.0);
    filter.push(3.0);
    TRIAL_TEST_EQ(filter.empty(), false);
    TRIAL_TEST_EQ(filter.full(), true);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 3.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.unbiased_variance(), 0.0);
}